

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
vector_utils::add(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                 vector<float,_std::allocator<float>_> *a,vector<float,_std::allocator<float>_> *b)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  ostream *poVar4;
  invalid_argument *this;
  long lVar5;
  long lVar6;
  allocator_type local_19;
  
  lVar5 = (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 == (long)(b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,lVar5 >> 2,&local_19);
    pfVar1 = (a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar5 = (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1;
    if (lVar5 != 0) {
      lVar5 = lVar5 >> 2;
      pfVar2 = (b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        pfVar3[lVar6] = pfVar1[lVar6] + pfVar2[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    return __return_storage_ptr__;
  }
  poVar4 = log_error();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"[Nelder-Mead] Add operands dimmensions do not match. ",0x35);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"dim(a)=",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; dim(b)=",9);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Operands dimmensions do not match");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<float> vector_utils::add(const std::vector<float> &a, const std::vector<float> &b)
{
  if (a.size() != b.size())
  {
    log_error() << "[Nelder-Mead] Add operands dimmensions do not match. "
      << "dim(a)=" << a.size() << "; dim(b)=" << b.size();
    throw std::invalid_argument("Operands dimmensions do not match");
  }

  std::vector<float> output(a.size());

  for (auto i = 0; i < a.size(); ++i)
  {
    output[i] = a[i] + b[i];
  }

  return output;
}